

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loop_unroll.cpp
# Opt level: O0

ir_visitor_status __thiscall
loop_unroll_count::visit_enter(loop_unroll_count *this,ir_dereference_array *ir)

{
  ir_rvalue *piVar1;
  loop_variable_state *this_00;
  bool bVar2;
  int iVar3;
  void *pvVar4;
  undefined4 extraout_var;
  ir_constant *piVar5;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  loop_variable *this_01;
  loop_variable *lv;
  ir_variable *array;
  ir_dereference_array *ir_local;
  loop_unroll_count *this_local;
  long lVar6;
  
  if (((this->options->EmitNoIndirectSampler != '\0') &&
      (bVar2 = glsl_type::is_array(ir->array->type), bVar2)) &&
     (bVar2 = glsl_type::contains_sampler(ir->array->type), bVar2)) {
    piVar1 = ir->array_index;
    pvVar4 = ralloc_parent(ir);
    iVar3 = (*(piVar1->super_ir_instruction)._vptr_ir_instruction[6])(piVar1,pvVar4,0);
    if (CONCAT44(extraout_var,iVar3) == 0) {
      this->unsupported_variable_indexing = true;
      return visit_continue;
    }
  }
  bVar2 = glsl_type::is_array(ir->array->type);
  if (((bVar2) || (bVar2 = glsl_type::is_matrix(ir->array->type), bVar2)) &&
     (piVar5 = ir_instruction::as_constant(&ir->array_index->super_ir_instruction),
     piVar5 == (ir_constant *)0x0)) {
    iVar3 = (*(ir->array->super_ir_instruction)._vptr_ir_instruction[8])();
    lVar6 = CONCAT44(extraout_var_00,iVar3);
    this_00 = this->ls;
    iVar3 = (*(ir->array_index->super_ir_instruction)._vptr_ir_instruction[8])();
    this_01 = loop_variable_state::get(this_00,(ir_variable *)CONCAT44(extraout_var_01,iVar3));
    if (((lVar6 != 0) && (this_01 != (loop_variable *)0x0)) &&
       (bVar2 = loop_variable::is_induction_var(this_01), bVar2)) {
      if (*(int *)(*(long *)(lVar6 + 0x20) + 0xc) == this->ls->limiting_terminator->iterations) {
        this->array_indexed_by_induction_var_with_exact_iterations = true;
      }
      switch(*(uint *)(lVar6 + 0x40) >> 0xc & 0xf) {
      case 0:
      case 6:
      case 7:
      case 8:
      case 9:
      case 0xb:
        if (this->options->EmitNoIndirectTemp != '\0') {
          this->unsupported_variable_indexing = true;
        }
        break;
      case 1:
      case 2:
        if (this->options->EmitNoIndirectUniform != '\0') {
          this->unsupported_variable_indexing = true;
        }
        break;
      case 4:
        if (this->options->EmitNoIndirectInput != '\0') {
          this->unsupported_variable_indexing = true;
        }
        break;
      case 5:
        if (this->options->EmitNoIndirectOutput != '\0') {
          this->unsupported_variable_indexing = true;
        }
      }
    }
  }
  return visit_continue;
}

Assistant:

virtual ir_visitor_status visit_enter(ir_dereference_array *ir)
   {
      /* Force unroll in case of dynamic indexing with sampler arrays
       * when EmitNoIndirectSampler is set.
       */
      if (options->EmitNoIndirectSampler) {
         if ((ir->array->type->is_array() &&
              ir->array->type->contains_sampler()) &&
             !ir->array_index->constant_expression_value(ralloc_parent(ir))) {
            unsupported_variable_indexing = true;
            return visit_continue;
         }
      }

      /* Check for arrays variably-indexed by a loop induction variable.
       * Unrolling the loop may convert that access into constant-indexing.
       *
       * Many drivers don't support particular kinds of variable indexing,
       * and have to resort to using lower_variable_index_to_cond_assign to
       * handle it.  This results in huge amounts of horrible code, so we'd
       * like to avoid that if possible.  Here, we just note that it will
       * happen.
       */
      if ((ir->array->type->is_array() || ir->array->type->is_matrix()) &&
          !ir->array_index->as_constant()) {
         ir_variable *array = ir->array->variable_referenced();
         loop_variable *lv = ls->get(ir->array_index->variable_referenced());
         if (array && lv && lv->is_induction_var()) {
            /* If an array is indexed by a loop induction variable, and the
             * array size is exactly the number of loop iterations, this is
             * probably a simple for-loop trying to access each element in
             * turn; the application may expect it to be unrolled.
             */
            if (int(array->type->length) == ls->limiting_terminator->iterations)
               array_indexed_by_induction_var_with_exact_iterations = true;

            switch (array->data.mode) {
            case ir_var_auto:
            case ir_var_temporary:
            case ir_var_const_in:
            case ir_var_function_in:
            case ir_var_function_out:
            case ir_var_function_inout:
               if (options->EmitNoIndirectTemp)
                  unsupported_variable_indexing = true;
               break;
            case ir_var_uniform:
            case ir_var_shader_storage:
               if (options->EmitNoIndirectUniform)
                  unsupported_variable_indexing = true;
               break;
            case ir_var_shader_in:
               if (options->EmitNoIndirectInput)
                  unsupported_variable_indexing = true;
               break;
            case ir_var_shader_out:
               if (options->EmitNoIndirectOutput)
                  unsupported_variable_indexing = true;
               break;
            }
         }
      }
      return visit_continue;
   }